

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_replay_linux.hpp
# Opt level: O0

void crash_handler(int param_1)

{
  bool bVar1;
  PerThreadData *per_thread_00;
  PerThreadData *per_thread;
  int param_0_local;
  
  bVar1 = write_all(crash_fd,"CRASH\n");
  if (!bVar1) {
    _exit(2);
  }
  if (global_replayer != (ThreadedReplayer *)0x0) {
    per_thread_00 = ThreadedReplayer::get_per_thread_data(global_replayer);
    crash_handler(global_replayer,per_thread_00);
  }
  _exit(2);
}

Assistant:

static void crash_handler(int)
{
	// stderr is reserved for generic logging.
	// stdout/stdin is for IPC with master process.

	if (!write_all(crash_fd, "CRASH\n"))
		_exit(2);

	// This might hang indefinitely if we are exceptionally unlucky,
	// the parent will have a timeout after receiving the crash message.
	// If that fails, it can SIGKILL us.
	// We want to make sure any database writing threads in the driver gets a chance to complete its work
	// before we die.

	if (global_replayer)
	{
		auto &per_thread = global_replayer->get_per_thread_data();
		crash_handler(*global_replayer, per_thread);
	}

	// Clean exit instead of reporting the segfault.
	// _exit is async-signal safe, but not exit().
	// Use exit code 2 to mark a segfaulted child.
	_exit(2);
}